

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.h
# Opt level: O0

void __thiscall GdlFeatureSetting::AddExtName(GdlFeatureSetting *this,utf16 wLangID,wstring *stu)

{
  GdlExtName *in_RDX;
  value_type *in_stack_ffffffffffffff48;
  wstring *this_00;
  wstring *in_stack_ffffffffffffff68;
  GdlExtName *in_stack_ffffffffffffff70;
  wstring local_88 [136];
  
  this_00 = local_88;
  std::__cxx11::wstring::wstring(this_00,(wstring *)in_RDX);
  GdlExtName::GdlExtName
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(utf16)((ulong)this_00 >> 0x30));
  std::vector<GdlExtName,_std::allocator<GdlExtName>_>::push_back
            ((vector<GdlExtName,_std::allocator<GdlExtName>_> *)in_RDX,in_stack_ffffffffffffff48);
  GdlExtName::~GdlExtName(in_RDX);
  std::__cxx11::wstring::~wstring(local_88);
  return;
}

Assistant:

void AddExtName(utf16 wLangID, std::wstring stu)
	{
		m_vextname.push_back(GdlExtName(stu, wLangID));
	}